

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.cpp
# Opt level: O2

void __thiscall
CTcMake::build_image_file
          (CTcMake *this,CTcHostIfc *hostifc,CResLoader *res_loader,char *image_fname,
          int *error_count,int *warning_count,CVmRuntimeSymbols *runtime_symtab,
          CVmRuntimeSymbols *runtime_macros,char *tool_data)

{
  err_frame_t *peVar1;
  CVmException *pCVar2;
  int iVar3;
  undefined8 *puVar4;
  long *plVar5;
  FILE *pFVar6;
  char *fname;
  CVmFile *fp_00;
  CTcMakeModule *mod;
  CVmFile *objfile;
  CVmFile *fp;
  err_frame_t err_cur__;
  char obj_fname [4096];
  
  fp = (CVmFile *)0x0;
  puVar4 = (undefined8 *)_ZTW11G_err_frame();
  err_cur__.prv_ = (err_frame_t *)*puVar4;
  plVar5 = (long *)_ZTW11G_err_frame();
  *plVar5 = (long)&err_cur__;
  err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
  if (err_cur__.state_ == 0) {
    CTcMain::init((EVP_PKEY_CTX *)hostifc);
    set_compiler_options(this);
    mod = (CTcMakeModule *)&this->mod_head_;
    while (mod = mod->nxt_, mod != (CTcMakeModule *)0x0) {
      if (mod->exclude_ == 0) {
        get_objfile(this,obj_fname,mod);
        pFVar6 = fopen(obj_fname,"rb");
        if (pFVar6 == (FILE *)0x0) {
          CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,0x296c,obj_fname);
        }
        else {
          fname = obj_fname;
          if (this->test_report_mode_ != 0) {
            fname = os_get_root_name(obj_fname);
          }
          fp_00 = (CVmFile *)operator_new(0x10);
          fp_00->fp_ = (osfildef *)0x0;
          fp_00->seek_base_ = 0;
          fp_00->fp_ = (osfildef *)pFVar6;
          fp_00->seek_base_ = 0;
          CTcGenTarg::load_object_file(G_cg,fp_00,fname);
          if (fp_00 != (CVmFile *)0x0) {
            CVmFile::~CVmFile(fp_00);
          }
          operator_delete(fp_00,0x10);
        }
      }
    }
    if ((G_tcmain->error_count_ == 0) &&
       (iVar3 = CTcParser::check_unresolved_externs(G_prs), iVar3 == 0)) {
      pFVar6 = fopen(image_fname,"wb");
      if (pFVar6 == (FILE *)0x0) {
        CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,0x296a,image_fname);
      }
      else {
        fp = (CVmFile *)operator_new(0x10);
        fp->fp_ = (osfildef *)0x0;
        fp->seek_base_ = 0;
        fp->fp_ = (osfildef *)pFVar6;
        fp->seek_base_ = 0;
        CTcGenTarg::write_to_image(G_cg,fp,this->data_xor_mask_,tool_data);
      }
    }
  }
  if (-1 < (short)err_cur__.state_) {
    err_cur__.state_ = err_cur__.state_ | 0x8000;
    *error_count = *error_count + G_tcmain->error_count_;
    *warning_count = *warning_count + G_tcmain->warning_count_;
    if (*error_count == 0) {
      if (runtime_symtab != (CVmRuntimeSymbols *)0x0) {
        CTcPrsSymtab::enum_entries(G_prs->global_symtab_,build_runtime_symtab_cb,runtime_symtab);
      }
      if (runtime_macros != (CVmRuntimeSymbols *)0x0) {
        (*G_tok->defines_->_vptr_CTcMacroTable[5])
                  (G_tok->defines_,build_runtime_macro_cb,runtime_macros);
      }
    }
    if (fp != (CVmFile *)0x0) {
      if (fp != (CVmFile *)0x0) {
        CVmFile::~CVmFile(fp);
      }
      operator_delete(fp,0x10);
    }
    if ((*error_count != 0) || ((this->warnings_as_errors_ != 0 && (*warning_count != 0)))) {
      remove(image_fname);
    }
    CTcMain::terminate();
  }
  peVar1 = err_cur__.prv_;
  puVar4 = (undefined8 *)_ZTW11G_err_frame();
  *puVar4 = peVar1;
  if ((err_cur__.state_ & 0x4001U) != 0) {
    puVar4 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(byte *)*puVar4 & 2) != 0) {
      plVar5 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar5 + 0x10));
    }
    pCVar2 = err_cur__.exc_;
    plVar5 = (long *)_ZTW11G_err_frame();
    *(CVmException **)(*plVar5 + 0x10) = pCVar2;
    err_rethrow();
  }
  if ((err_cur__.state_ & 2U) != 0) {
    free(err_cur__.exc_);
  }
  return;
}

Assistant:

void CTcMake::build_image_file(CTcHostIfc *hostifc,
                               CResLoader *res_loader,
                               const char *image_fname,
                               int *error_count, int *warning_count,
                               CVmRuntimeSymbols *runtime_symtab,
                               CVmRuntimeSymbols *runtime_macros,
                               const char tool_data[4])
{
    osfildef *fpout;
    CVmFile *volatile fp = 0;
    CVmFile *volatile objfile = 0;

    err_try
    {
        CTcMakeModule *mod;

        /* initialize the compiler */
        CTcMain::init(hostifc, res_loader, source_charset_);

        /* set options */
        set_compiler_options();

        /* load each object module */
        for (mod = mod_head_ ; mod != 0 ; mod = mod->get_next())
        {
            osfildef *objfp;
            char obj_fname[OSFNMAX];

            /* if this module is excluded, skip it */
            if (mod->is_excluded())
                continue;

            /* derive the object filename */
            get_objfile(obj_fname, mod);

            /* open the file */
            objfp = osfoprb(obj_fname, OSFTT3OBJ);
            if (objfp == 0)
            {
                /* log the error */
                G_tcmain->log_error(0, 0, TC_SEV_ERROR,
                                    TCERR_MAKE_CANNOT_OPEN_OBJ, obj_fname);
            }
            else
            {
                const char *report_fname;

                /* 
                 *   if we're in test reporting mode, use the root name only
                 *   in error reports 
                 */
                if (test_report_mode_)
                    report_fname = os_get_root_name((char *)obj_fname);
                else
                    report_fname = obj_fname;
                
                /* set up the file object */
                objfile = new CVmFile();
                objfile->set_file(objfp, 0);

                /* load it */
                G_cg->load_object_file(objfile, report_fname);

                /* done with the file - close it */
                delete objfile;
                objfile = 0;
            }
        }

        /* if we encountered errors loading object files, give up */
        if (G_tcmain->get_error_count() != 0)
            goto done;

        /* check for unresolved externals */
        if (G_prs->check_unresolved_externs())
            goto done;

        /* set up the output file */
        fpout = osfopwb(image_fname, OSFTT3IMG);
        if (fpout == 0)
        {
            G_tcmain->log_error(0, 0, TC_SEV_ERROR,
                                TCERR_MAKE_CANNOT_CREATE_IMG, image_fname);
            goto done;
        }
        fp = new CVmFile();
        fp->set_file(fpout, 0);

        /* write the image file */
        G_cg->write_to_image(fp, data_xor_mask_, tool_data);

    done: ;
    }